

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O0

void __thiscall t_json_generator::write_key_and_bool(t_json_generator *this,string *key,bool val)

{
  ostream *poVar1;
  char *pcVar2;
  string local_40;
  byte local_19;
  string *psStack_18;
  bool val_local;
  string *key_local;
  t_json_generator *this_local;
  
  local_19 = val;
  psStack_18 = key;
  key_local = (string *)this;
  write_comma_if_needed(this);
  poVar1 = t_generator::indent(&this->super_t_generator,(ostream *)&this->f_json_);
  json_str(&local_40,this,key);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = "false";
  if ((local_19 & 1) != 0) {
    pcVar2 = "true";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::string::~string((string *)&local_40);
  indicate_comma_needed(this);
  return;
}

Assistant:

void t_json_generator::write_key_and_bool(string key, bool val) {
  write_comma_if_needed();
  indent(f_json_) << json_str(key) << ": " << (val ? "true" : "false");
  indicate_comma_needed();
}